

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::GnuHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,GnuHash *this,char *name)

{
  element_type *peVar1;
  uchar uVar2;
  uchar uVar3;
  Elf64_Section EVar4;
  Elf64_Addr EVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auStack_78 [8];
  value_type sym;
  unsigned_long t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char *local_40;
  pair<unsigned_int,_Elf64_Sym> *local_38;
  
  bVar9 = *name;
  if (bVar9 == 0) {
    uVar10 = 0x1505;
  }
  else {
    pbVar8 = (byte *)(name + 1);
    uVar10 = 0x1505;
    do {
      uVar10 = (ulong)((int)uVar10 * 0x21 + (uint)bVar9);
      bVar9 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar9 != 0);
  }
  local_40 = name;
  Reader::readObj<unsigned_long>
            ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(ulong)((int)((uVar10 >> 6) % (ulong)(this->header).bloom_size) * 8 + 0x10),
             &sym.st_size,1);
  local_38 = __return_storage_ptr__;
  if (((1L << ((byte)((uint)uVar10 >> ((byte)(this->header).bloom_shift & 0x1f)) & 0x3f) |
       1L << (uVar10 & 0x3f)) & ~CONCAT44(sym.st_size._4_4_,(uint)sym.st_size)) == 0) {
    Reader::readObj<unsigned_int>
              ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)((this->header).bloom_size * 8 +
                              (int)(uVar10 % (ulong)(this->header).nbuckets) * 4 + 0x10),
               (uint *)&sym.st_size,1);
    uVar11 = (uint)sym.st_size;
    if ((this->header).symoffset <= (uint)sym.st_size) {
      while( true ) {
        Reader::readObj<Elf64_Sym>
                  ((this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)uVar11 * 0x18,(value_type *)auStack_78,1);
        Reader::readObj<unsigned_int>
                  ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)((((this->header).nbuckets - (this->header).symoffset) + uVar11) *
                                   4 + (this->header).bloom_size * 8 + 0x10),(uint *)&sym.st_size,1)
        ;
        uVar6 = (uint)sym.st_size;
        if (((uint)sym.st_size ^ (uint)uVar10) < 2) {
          peVar1 = (this->strings).
                   super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar1->_vptr_Reader[7])(&sym.st_size,peVar1,(ulong)(uint)auStack_78._0_4_);
          iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &sym.st_size,local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(sym.st_size._4_4_,(uint)sym.st_size) != &local_50) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(sym.st_size._4_4_,(uint)sym.st_size),
                            local_50._M_allocated_capacity + 1);
          }
          if (iVar7 == 0) {
            local_38->first = uVar11;
            (local_38->second).st_name = auStack_78._0_4_;
            (local_38->second).st_info = (char)auStack_78._4_4_;
            (local_38->second).st_other = SUB41(auStack_78._4_4_,1);
            (local_38->second).st_shndx = SUB42(auStack_78._4_4_,2);
            (local_38->second).st_value = sym._0_8_;
            goto LAB_0015923a;
          }
        }
        if ((uVar6 & 1) != 0) break;
        uVar11 = uVar11 + 1;
      }
    }
    undef();
  }
  else {
    undef();
  }
  local_38->first = 0;
  EVar5 = undef::theUndef.undefSym.st_value;
  uVar2 = undef::theUndef.undefSym.st_info;
  uVar3 = undef::theUndef.undefSym.st_other;
  EVar4 = undef::theUndef.undefSym.st_shndx;
  (local_38->second).st_name = undef::theUndef.undefSym.st_name;
  (local_38->second).st_info = uVar2;
  (local_38->second).st_other = uVar3;
  (local_38->second).st_shndx = EVar4;
  (local_38->second).st_value = EVar5;
  sym.st_value = undef::theUndef.undefSym.st_size;
LAB_0015923a:
  (local_38->second).st_size = sym.st_value;
  return local_38;
}

Assistant:

std::pair<uint32_t, Sym>
GnuHash::findSymbol(const char *name) const {
    auto symhash = gnu_hash(name);

    auto bloomword = hash->readObj<Elf::Off>(bloomoff((symhash/ELF_BITS) % header.bloom_size));

    Elf::Off mask = Elf::Off(1) << symhash % ELF_BITS |
                    Elf::Off(1) << (symhash >> header.bloom_shift) % ELF_BITS;

    if ((bloomword & mask) != mask) {
       return std::make_pair(0, undef());
    }

    auto idx = hash->readObj<uint32_t>(bucketoff(symhash % header.nbuckets));
    if (idx < header.symoffset) {
        return std::make_pair(0, undef());
    }
    for (;;) {
        auto sym = syms->readObj<Sym>(idx * sizeof (Sym));
        auto chainhash = hash->readObj<uint32_t>(chainoff(idx - header.symoffset));
        if ((chainhash | 1U)  == (symhash | 1U) && strings->readString(sym.st_name) == name)
              return std::make_pair(idx, sym);
        if ((chainhash & 1U) != 0) {
           return std::make_pair(0, undef());
        }
        ++idx;
    }
}